

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_6_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  longlong lVar25;
  longlong lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 (*pauVar44) [16];
  undefined4 uVar45;
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  longlong lVar50;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  ushort uVar51;
  short sVar52;
  ushort uVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  ushort uVar67;
  ushort uVar68;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar69;
  ulong uVar66;
  ulong uVar70;
  ulong uVar71;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q0;
  __m128i p0;
  __m128i x0;
  __m128i x1;
  __m128i x2;
  __m128i x3;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i pq1_pq2;
  __m128i pq0x2_pq1;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i one;
  __m128i t80;
  __m128i four;
  __m128i zero;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i abs_p1p0;
  __m128i q1q0_1;
  __m128i p1p0_1;
  __m128i pq [3];
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one_1;
  __m128i zero_1;
  __m128i *palVar72;
  __m128i *x1_00;
  __m128i *x0_00;
  __m128i *p1p0_00;
  __m128i *d1_00;
  __m128i *d0_00;
  undefined4 in_stack_ffffffffffffeff0;
  undefined2 in_stack_ffffffffffffeff4;
  undefined2 in_stack_ffffffffffffeff6;
  __m128i *in_stack_ffffffffffffeff8;
  __m128i *in_stack_fffffffffffff000;
  __m128i *in_stack_fffffffffffff008;
  longlong local_fa8;
  longlong lStack_fa0;
  longlong local_f98;
  longlong lStack_f90;
  longlong local_f88 [3];
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  longlong local_f28 [2];
  longlong local_f18 [2];
  longlong local_f08 [2];
  longlong local_ef8 [2];
  longlong local_ee8 [2];
  longlong local_ed8 [2];
  longlong local_ec8 [2];
  longlong local_eb8 [2];
  uint local_ea4;
  uint8_t *local_ea0;
  uint8_t *local_e98;
  uint8_t *local_e90;
  int local_e84;
  long local_e80;
  short local_df8;
  short sStack_df6;
  short sStack_df4;
  short sStack_df2;
  short sStack_df0;
  short sStack_dee;
  short sStack_dec;
  short sStack_dea;
  short local_de8;
  short sStack_de6;
  short sStack_de4;
  short sStack_de2;
  short sStack_de0;
  short sStack_dde;
  short sStack_ddc;
  short sStack_dda;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  longlong local_d98;
  longlong lStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  ushort local_d68;
  ushort uStack_d66;
  ushort uStack_d64;
  ushort uStack_d62;
  ushort uStack_d60;
  ushort uStack_d5e;
  ushort uStack_d5c;
  ushort uStack_d5a;
  ushort local_d58;
  ushort uStack_d56;
  ushort uStack_d54;
  ushort uStack_d52;
  ushort uStack_d50;
  ushort uStack_d4e;
  ushort uStack_d4c;
  ushort uStack_d4a;
  ulong local_d48;
  ulong uStack_d40;
  uint local_d38;
  uint uStack_d34;
  uint uStack_d30;
  uint uStack_d2c;
  undefined8 local_d28;
  undefined8 uStack_d20;
  ulong local_d18;
  ulong uStack_d10;
  ulong local_d08;
  ulong uStack_d00;
  longlong local_cf8;
  longlong lStack_cf0;
  longlong local_ce8;
  longlong lStack_ce0;
  longlong local_cd8;
  __m128i *palStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  longlong local_c98 [2];
  longlong local_c88 [2];
  longlong local_c78 [2];
  uint local_c64;
  uint8_t *local_c60;
  uint8_t *local_c58;
  uint8_t *local_c50;
  undefined1 (*local_c48) [16];
  undefined1 (*local_c40) [16];
  __m128i *local_c38;
  __m128i *local_c30;
  __m128i *local_c28;
  __m128i *local_c20;
  __m128i *local_c18;
  longlong *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  ulong local_b98;
  __m128i *in_stack_fffffffffffff470;
  __m128i *in_stack_fffffffffffff478;
  __m128i *in_stack_fffffffffffff480;
  __m128i *mask_00;
  undefined8 local_b08;
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  uint local_a54;
  __m128i *local_a50;
  undefined1 (*local_a48) [16];
  undefined1 (*local_a40) [16];
  ulong *local_a38;
  ulong *local_a30;
  ulong *local_a28;
  ulong *local_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  ulong local_998;
  ulong uStack_990;
  ulong local_978;
  undefined8 uStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  ulong local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  undefined8 uStack_910;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  ushort uStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  ulong uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined2 local_8ae;
  undefined2 local_8ac;
  undefined2 local_8aa;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  longlong local_888;
  longlong lStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  longlong local_7e8;
  __m128i *palStack_7e0;
  longlong local_7d8;
  __m128i *palStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  longlong local_778;
  longlong lStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  longlong local_748;
  longlong lStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  longlong local_728;
  longlong lStack_720;
  short local_718;
  short sStack_716;
  short sStack_714;
  short sStack_712;
  short sStack_710;
  short sStack_70e;
  short sStack_70c;
  short sStack_70a;
  longlong local_708;
  longlong lStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  longlong local_6e8;
  longlong lStack_6e0;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  longlong local_6c8;
  __m128i *palStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  ulong local_668;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 local_648;
  undefined4 uStack_644;
  ulong uStack_640;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  uint local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  uint local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  longlong local_568;
  longlong lStack_560;
  longlong local_558;
  __m128i *palStack_550;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  longlong local_528;
  __m128i *palStack_520;
  longlong local_518;
  longlong lStack_510;
  longlong local_508;
  longlong lStack_500;
  longlong local_4f8;
  __m128i *palStack_4f0;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  ulong uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  ulong uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  ulong uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined2 local_338;
  undefined2 local_336;
  undefined2 local_334;
  undefined2 local_332;
  undefined2 local_330;
  undefined2 local_32e;
  undefined2 local_32c;
  undefined2 local_32a;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined2 local_318;
  undefined2 local_316;
  undefined2 local_314;
  undefined2 local_312;
  undefined2 local_310;
  undefined2 local_30e;
  undefined2 local_30c;
  undefined2 local_30a;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined2 local_2f8;
  undefined2 local_2f6;
  undefined2 local_2f4;
  undefined2 local_2f2;
  undefined2 local_2f0;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined2 local_2d0;
  undefined2 local_2ce;
  undefined2 local_2cc;
  undefined2 local_2ca;
  undefined2 local_2c8;
  undefined2 local_2c6;
  undefined2 local_2c4;
  undefined2 local_2c2;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  longlong local_188;
  longlong lStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_bf0 = (undefined8 *)(in_RDI + -6);
  local_f38 = *local_bf0;
  uStack_f30 = *(undefined8 *)(in_RDI + 2);
  local_bf8 = (undefined8 *)(in_RDI + -6 + (long)in_ESI * 2);
  local_f48 = *local_bf8;
  uStack_f40 = local_bf8[1];
  local_c00 = (undefined8 *)(in_RDI + -6 + (long)(in_ESI * 2) * 2);
  local_f58 = *local_c00;
  uStack_f50 = local_c00[1];
  local_c08 = (undefined8 *)(in_RDI + -6 + (long)(in_ESI * 3) * 2);
  local_f68 = *local_c08;
  uStack_f60 = local_c08[1];
  palVar72 = &local_f28;
  d0_00 = &local_f08;
  d1_00 = &local_ef8;
  p1p0_00 = &local_ee8;
  x0_00 = &local_ed8;
  x1_00 = &local_ec8;
  local_ea4 = in_R9D;
  local_ea0 = in_R8;
  local_e98 = in_RCX;
  local_e90 = in_RDX;
  local_e84 = in_ESI;
  local_e80 = in_RDI;
  highbd_transpose4x8_8x4_sse2
            (x0_00,x1_00,palVar72,&local_f18,d0_00,d1_00,d1_00,d0_00,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffeff6,
                      CONCAT24(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0)),
             in_stack_ffffffffffffeff8,in_stack_fffffffffffff000,in_stack_fffffffffffff008);
  local_c40 = (undefined1 (*) [16])&local_f98;
  local_c48 = (undefined1 (*) [16])&local_fa8;
  local_c50 = local_e90;
  local_c58 = local_e98;
  local_c60 = local_ea0;
  local_c64 = local_ea4;
  local_cf8 = (*x0_00)[0];
  lStack_cf0 = (*p1p0_00)[0];
  local_ce8 = (*x1_00)[0];
  lStack_ce0 = (*d1_00)[0];
  local_cd8 = local_eb8[0];
  palStack_cd0 = (__m128i *)(*d0_00)[0];
  local_be8 = 0;
  uStack_be0 = 0;
  local_d78 = 0;
  uStack_d70 = 0;
  local_8aa = 4;
  local_32a = 4;
  local_32c = 4;
  local_32e = 4;
  local_330 = 4;
  local_332 = 4;
  local_334 = 4;
  local_336 = 4;
  local_338 = 4;
  local_d88 = 0x4000400040004;
  uStack_d80 = 0x4000400040004;
  local_8ac = 1;
  local_30a = 1;
  local_30c = 1;
  local_30e = 1;
  local_310 = 1;
  local_312 = 1;
  local_314 = 1;
  local_316 = 1;
  local_318 = 1;
  local_da8 = 0x1000100010001;
  uStack_da0 = 0x1000100010001;
  local_c38 = d0_00;
  local_c30 = d1_00;
  local_c28 = p1p0_00;
  local_c20 = x0_00;
  local_c18 = x1_00;
  local_c10 = local_eb8;
  mask_00 = palStack_cd0;
  local_348 = local_d88;
  uStack_340 = uStack_d80;
  local_328 = local_da8;
  uStack_320 = uStack_da0;
  get_limit(local_e90,local_e98,local_ea0,local_ea4,&local_c78,&local_c88,&local_c98,
            (__m128i *)&local_d98);
  highbd_hev_filter_mask_x_sse2
            (d0_00,(int)((ulong)d1_00 >> 0x20),p1p0_00,x0_00,x1_00,palVar72,
             in_stack_fffffffffffff470,in_stack_fffffffffffff478,in_stack_fffffffffffff480,mask_00);
  local_a40 = local_c48;
  local_a48 = local_c40;
  local_a54 = local_c64;
  local_a18 = 0;
  uStack_a10 = 0;
  local_a68 = 0;
  uStack_a60 = 0;
  local_8ae = 1;
  local_2ea = 1;
  local_2ec = 1;
  local_2ee = 1;
  local_2f0 = 1;
  local_2f2 = 1;
  local_2f4 = 1;
  local_2f6 = 1;
  local_2f8 = 1;
  local_a78 = 0x1000100010001;
  uStack_a70 = 0x1000100010001;
  local_59c = local_c64;
  auVar53._8_8_ = 0x1000100010001;
  auVar53._0_8_ = 0x1000100010001;
  local_358 = psllw(auVar53,ZEXT416(local_c64));
  auVar31._8_8_ = 0x1000100010001;
  auVar31._0_8_ = 0x1000100010001;
  local_378 = psubsw(local_358,auVar31);
  auVar37._8_8_ = lStack_d90;
  auVar37._0_8_ = local_d98;
  local_a88 = psubsw(local_378,auVar37);
  auVar38._8_8_ = lStack_d90;
  auVar38._0_8_ = local_d98;
  local_398 = 0;
  uStack_390 = 0;
  auVar53 = psubsw(ZEXT816(0),auVar38);
  local_2c2 = 3;
  local_2c4 = 3;
  local_2c6 = 3;
  local_2c8 = 3;
  local_2ca = 4;
  local_2cc = 4;
  local_2ce = 4;
  local_2d0 = 4;
  local_aa8 = 0x4000400040004;
  uStack_aa0 = 0x3000300030003;
  auVar42._8_8_ = uStack_d00;
  auVar42._0_8_ = local_d08;
  auVar39._8_8_ = lStack_d90;
  auVar39._0_8_ = local_d98;
  auVar54 = psubsw(auVar42,auVar39);
  auVar41._8_8_ = uStack_d10;
  auVar41._0_8_ = local_d18;
  auVar40._8_8_ = lStack_d90;
  auVar40._0_8_ = local_d98;
  auVar55 = psubsw(auVar41,auVar40);
  local_ab8._0_8_ = auVar54._0_8_;
  local_ab8._8_8_ = auVar54._8_8_;
  local_ac8._0_8_ = auVar55._0_8_;
  local_ac8._8_8_ = auVar55._8_8_;
  local_3f8 = local_ab8._0_8_;
  uStack_3f0 = local_ab8._8_8_;
  local_408 = local_ac8._0_8_;
  uStack_400 = local_ac8._8_8_;
  local_ad8 = psubsw(auVar54,auVar55);
  local_2b0 = local_a98;
  local_2b8 = local_a88;
  local_1c0 = local_ad8;
  uVar1 = local_ad8._0_8_;
  uVar2 = local_ad8._8_8_;
  local_98._0_2_ = local_ad8._0_2_;
  local_98._2_2_ = local_ad8._2_2_;
  local_98._4_2_ = local_ad8._4_2_;
  local_98._6_2_ = local_ad8._6_2_;
  uStack_90._0_2_ = local_ad8._8_2_;
  uStack_90._2_2_ = local_ad8._10_2_;
  uStack_90._4_2_ = local_ad8._12_2_;
  uStack_90._6_2_ = local_ad8._14_2_;
  local_a8._0_2_ = local_a88._0_2_;
  local_a8._2_2_ = local_a88._2_2_;
  local_a8._4_2_ = local_a88._4_2_;
  local_a8._6_2_ = local_a88._6_2_;
  uStack_a0._0_2_ = local_a88._8_2_;
  uStack_a0._2_2_ = local_a88._10_2_;
  uStack_a0._4_2_ = local_a88._12_2_;
  uStack_a0._6_2_ = local_a88._14_2_;
  local_ad8._0_2_ =
       (ushort)((short)local_a8 < (short)local_98) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_98) * (short)local_98;
  local_ad8._2_2_ =
       (ushort)(local_a8._2_2_ < local_98._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_98._2_2_) * local_98._2_2_;
  local_ad8._4_2_ =
       (ushort)(local_a8._4_2_ < local_98._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_98._4_2_) * local_98._4_2_;
  local_ad8._6_2_ =
       (ushort)(local_a8._6_2_ < local_98._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_98._6_2_) * local_98._6_2_;
  local_ad8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_90) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_90) * (short)uStack_90;
  local_ad8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_90._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_90._2_2_) * uStack_90._2_2_;
  local_ad8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_90._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_90._4_2_) * uStack_90._4_2_;
  local_ad8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_90._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_90._6_2_) * uStack_90._6_2_;
  uVar3 = local_ad8._0_8_;
  uVar4 = local_ad8._8_8_;
  uVar5 = local_a98._0_8_;
  uVar6 = local_a98._8_8_;
  local_198._0_2_ = local_ad8._0_2_;
  local_198._2_2_ = local_ad8._2_2_;
  local_198._4_2_ = local_ad8._4_2_;
  local_198._6_2_ = local_ad8._6_2_;
  uStack_190._0_2_ = local_ad8._8_2_;
  uStack_190._2_2_ = local_ad8._10_2_;
  uStack_190._4_2_ = local_ad8._12_2_;
  uStack_190._6_2_ = local_ad8._14_2_;
  local_1a8._0_2_ = local_a98._0_2_;
  local_1a8._2_2_ = local_a98._2_2_;
  local_1a8._4_2_ = local_a98._4_2_;
  local_1a8._6_2_ = local_a98._6_2_;
  uStack_1a0._0_2_ = local_a98._8_2_;
  uStack_1a0._2_2_ = local_a98._10_2_;
  uStack_1a0._4_2_ = local_a98._12_2_;
  uStack_1a0._6_2_ = local_a98._14_2_;
  local_ad8._0_2_ =
       (ushort)((short)local_198 < (short)local_1a8) * (short)local_1a8 |
       (ushort)((short)local_198 >= (short)local_1a8) * (short)local_198;
  local_ad8._2_2_ =
       (ushort)(local_198._2_2_ < local_1a8._2_2_) * local_1a8._2_2_ |
       (ushort)(local_198._2_2_ >= local_1a8._2_2_) * local_198._2_2_;
  local_ad8._4_2_ =
       (ushort)(local_198._4_2_ < local_1a8._4_2_) * local_1a8._4_2_ |
       (ushort)(local_198._4_2_ >= local_1a8._4_2_) * local_198._4_2_;
  local_ad8._6_2_ =
       (ushort)(local_198._6_2_ < local_1a8._6_2_) * local_1a8._6_2_ |
       (ushort)(local_198._6_2_ >= local_1a8._6_2_) * local_198._6_2_;
  local_ad8._8_2_ =
       (ushort)((short)uStack_190 < (short)uStack_1a0) * (short)uStack_1a0 |
       (ushort)((short)uStack_190 >= (short)uStack_1a0) * (short)uStack_190;
  local_ad8._10_2_ =
       (ushort)(uStack_190._2_2_ < uStack_1a0._2_2_) * uStack_1a0._2_2_ |
       (ushort)(uStack_190._2_2_ >= uStack_1a0._2_2_) * uStack_190._2_2_;
  local_ad8._12_2_ =
       (ushort)(uStack_190._4_2_ < uStack_1a0._4_2_) * uStack_1a0._4_2_ |
       (ushort)(uStack_190._4_2_ >= uStack_1a0._4_2_) * uStack_190._4_2_;
  local_ad8._14_2_ =
       (ushort)(uStack_190._6_2_ < uStack_1a0._6_2_) * uStack_1a0._6_2_ |
       (ushort)(uStack_190._6_2_ >= uStack_1a0._6_2_) * uStack_190._6_2_;
  local_978 = local_ad8._8_8_;
  uStack_970 = 0;
  local_418 = local_ad8._8_8_ & local_cb8;
  uStack_410 = 0;
  local_428 = local_ad8._0_8_;
  uStack_420 = local_ad8._8_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_418;
  auVar56 = psubsw(auVar30,local_ad8);
  local_ae8._0_8_ = auVar56._0_8_;
  local_ae8._8_8_ = auVar56._8_8_;
  local_438 = local_ae8._0_8_;
  uStack_430 = local_ae8._8_8_;
  local_448 = local_ad8._0_8_;
  uStack_440 = local_ad8._8_8_;
  auVar56 = psubsw(auVar56,local_ad8);
  local_ae8._0_8_ = auVar56._0_8_;
  local_ae8._8_8_ = auVar56._8_8_;
  local_458 = local_ae8._0_8_;
  uStack_450 = local_ae8._8_8_;
  local_468 = local_ad8._0_8_;
  uStack_460 = local_ad8._8_8_;
  local_ae8 = psubsw(auVar56,local_ad8);
  local_200 = local_ae8;
  uVar7 = local_ae8._0_8_;
  uVar8 = local_ae8._8_8_;
  local_88 = local_a88._0_8_;
  uStack_80 = local_a88._8_8_;
  local_78._0_2_ = local_ae8._0_2_;
  local_78._2_2_ = local_ae8._2_2_;
  local_78._4_2_ = local_ae8._4_2_;
  local_78._6_2_ = local_ae8._6_2_;
  uStack_70._0_2_ = local_ae8._8_2_;
  uStack_70._2_2_ = local_ae8._10_2_;
  uStack_70._4_2_ = local_ae8._12_2_;
  uStack_70._6_2_ = local_ae8._14_2_;
  local_ae8._0_2_ =
       (ushort)((short)local_a8 < (short)local_78) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_78) * (short)local_78;
  local_ae8._2_2_ =
       (ushort)(local_a8._2_2_ < local_78._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_78._2_2_) * local_78._2_2_;
  local_ae8._4_2_ =
       (ushort)(local_a8._4_2_ < local_78._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_78._4_2_) * local_78._4_2_;
  local_ae8._6_2_ =
       (ushort)(local_a8._6_2_ < local_78._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_78._6_2_) * local_78._6_2_;
  local_ae8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_70) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_70) * (short)uStack_70;
  local_ae8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_70._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_70._2_2_) * uStack_70._2_2_;
  local_ae8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_70._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_70._4_2_) * uStack_70._4_2_;
  local_ae8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_70._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_70._6_2_) * uStack_70._6_2_;
  uVar9 = local_ae8._0_8_;
  uVar10 = local_ae8._8_8_;
  local_a98._0_8_ = auVar53._0_8_;
  uVar11 = local_a98._0_8_;
  local_a98._8_8_ = auVar53._8_8_;
  uVar12 = local_a98._8_8_;
  local_1d8._0_2_ = local_ae8._0_2_;
  local_1d8._2_2_ = local_ae8._2_2_;
  local_1d8._4_2_ = local_ae8._4_2_;
  local_1d8._6_2_ = local_ae8._6_2_;
  uStack_1d0._0_2_ = local_ae8._8_2_;
  uStack_1d0._2_2_ = local_ae8._10_2_;
  uStack_1d0._4_2_ = local_ae8._12_2_;
  uStack_1d0._6_2_ = local_ae8._14_2_;
  local_1e8._0_2_ = auVar53._0_2_;
  local_1e8._2_2_ = auVar53._2_2_;
  local_1e8._4_2_ = auVar53._4_2_;
  local_1e8._6_2_ = auVar53._6_2_;
  uStack_1e0._0_2_ = auVar53._8_2_;
  uStack_1e0._2_2_ = auVar53._10_2_;
  uStack_1e0._4_2_ = auVar53._12_2_;
  uStack_1e0._6_2_ = auVar53._14_2_;
  local_ae8._0_2_ =
       (ushort)((short)local_1d8 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_1d8 >= (short)local_1e8) * (short)local_1d8;
  local_ae8._2_2_ =
       (ushort)(local_1d8._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_1d8._2_2_ >= local_1e8._2_2_) * local_1d8._2_2_;
  local_ae8._4_2_ =
       (ushort)(local_1d8._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_1d8._4_2_ >= local_1e8._4_2_) * local_1d8._4_2_;
  local_ae8._6_2_ =
       (ushort)(local_1d8._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_1d8._6_2_ >= local_1e8._6_2_) * local_1d8._6_2_;
  local_ae8._8_2_ =
       (ushort)((short)uStack_1d0 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_1d0 >= (short)uStack_1e0) * (short)uStack_1d0;
  local_ae8._10_2_ =
       (ushort)(uStack_1d0._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_1d0._2_2_ >= uStack_1e0._2_2_) * uStack_1d0._2_2_;
  local_ae8._12_2_ =
       (ushort)(uStack_1d0._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_1d0._4_2_ >= uStack_1e0._4_2_) * uStack_1d0._4_2_;
  local_ae8._14_2_ =
       (ushort)(uStack_1d0._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_1d0._6_2_ >= uStack_1e0._6_2_) * uStack_1d0._6_2_;
  local_ae8._0_8_ = SUB168(local_ae8,0);
  local_ae8._8_8_ = SUB168(local_ae8,8);
  local_998 = local_ae8._0_8_;
  uStack_990 = local_ae8._8_8_;
  local_9c8 = local_ae8._0_8_ & local_ca8;
  uStack_9c0 = local_ae8._8_8_ & uStack_ca0;
  local_108 = 0x4000400040004;
  uStack_100 = 0x3000300030003;
  auVar36._8_8_ = local_9c8;
  auVar36._0_8_ = local_9c8;
  auVar35._8_8_ = 0x3000300030003;
  auVar35._0_8_ = 0x4000400040004;
  local_af8 = paddsw(auVar36,auVar35);
  local_240 = local_af8;
  uVar13 = local_af8._0_8_;
  uVar14 = local_af8._8_8_;
  local_68 = local_a88._0_8_;
  uStack_60 = local_a88._8_8_;
  local_58._0_2_ = local_af8._0_2_;
  local_58._2_2_ = local_af8._2_2_;
  local_58._4_2_ = local_af8._4_2_;
  local_58._6_2_ = local_af8._6_2_;
  uStack_50._0_2_ = local_af8._8_2_;
  uStack_50._2_2_ = local_af8._10_2_;
  uStack_50._4_2_ = local_af8._12_2_;
  uStack_50._6_2_ = local_af8._14_2_;
  local_af8._0_2_ =
       (ushort)((short)local_a8 < (short)local_58) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_58) * (short)local_58;
  local_af8._2_2_ =
       (ushort)(local_a8._2_2_ < local_58._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_58._2_2_) * local_58._2_2_;
  local_af8._4_2_ =
       (ushort)(local_a8._4_2_ < local_58._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_58._4_2_) * local_58._4_2_;
  local_af8._6_2_ =
       (ushort)(local_a8._6_2_ < local_58._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_58._6_2_) * local_58._6_2_;
  local_af8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_50) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_50) * (short)uStack_50;
  local_af8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_50._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_50._2_2_) * uStack_50._2_2_;
  local_af8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_50._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_50._4_2_) * uStack_50._4_2_;
  local_af8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_50._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_50._6_2_) * uStack_50._6_2_;
  uVar15 = local_af8._0_8_;
  uVar16 = local_af8._8_8_;
  local_228 = local_a98._0_8_;
  uStack_220 = local_a98._8_8_;
  local_218._0_2_ = local_af8._0_2_;
  local_218._2_2_ = local_af8._2_2_;
  local_218._4_2_ = local_af8._4_2_;
  local_218._6_2_ = local_af8._6_2_;
  uStack_210._0_2_ = local_af8._8_2_;
  uStack_210._2_2_ = local_af8._10_2_;
  uStack_210._4_2_ = local_af8._12_2_;
  uStack_210._6_2_ = local_af8._14_2_;
  local_af8._0_2_ =
       (ushort)((short)local_218 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_218 >= (short)local_1e8) * (short)local_218;
  local_af8._2_2_ =
       (ushort)(local_218._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_218._2_2_ >= local_1e8._2_2_) * local_218._2_2_;
  local_af8._4_2_ =
       (ushort)(local_218._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_218._4_2_ >= local_1e8._4_2_) * local_218._4_2_;
  local_af8._6_2_ =
       (ushort)(local_218._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_218._6_2_ >= local_1e8._6_2_) * local_218._6_2_;
  local_af8._8_2_ =
       (ushort)((short)uStack_210 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_210 >= (short)uStack_1e0) * (short)uStack_210;
  local_af8._10_2_ =
       (ushort)(uStack_210._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_210._2_2_ >= uStack_1e0._2_2_) * uStack_210._2_2_;
  local_af8._12_2_ =
       (ushort)(uStack_210._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_210._4_2_ >= uStack_1e0._4_2_) * uStack_210._4_2_;
  local_af8._14_2_ =
       (ushort)(uStack_210._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_210._6_2_ >= uStack_1e0._6_2_) * uStack_210._6_2_;
  local_b8 = local_af8._0_8_;
  uStack_b0 = local_af8._8_8_;
  local_bc = 3;
  auVar57 = psraw(local_af8,ZEXT416(3));
  local_af8._0_8_ = auVar57._0_8_;
  local_af8._8_8_ = auVar57._8_8_;
  uStack_9f0 = local_af8._8_8_;
  local_9d8 = local_af8._0_8_;
  uStack_9d0 = local_af8._8_8_;
  local_9e8 = local_af8._0_8_;
  uStack_9e0 = local_af8._8_8_;
  local_118 = local_af8._0_8_;
  uStack_110 = local_af8._0_8_;
  local_128 = 0x1000100010001;
  uStack_120 = 0x1000100010001;
  auVar34._8_8_ = local_af8._0_8_;
  auVar34._0_8_ = local_af8._0_8_;
  auVar33._8_8_ = 0x1000100010001;
  auVar33._0_8_ = 0x1000100010001;
  auVar56 = paddsw(auVar34,auVar33);
  local_ae8._0_8_ = auVar56._0_8_;
  local_ae8._8_8_ = auVar56._8_8_;
  local_d8 = local_ae8._0_8_;
  uStack_d0 = local_ae8._8_8_;
  local_dc = 1;
  auVar58 = psraw(auVar56,ZEXT416(1));
  local_ae8._0_8_ = auVar58._0_8_;
  local_ae8._8_8_ = auVar58._8_8_;
  uStack_640 = local_ae8._8_8_;
  local_a08 = ~local_cb8 & local_ae8._0_8_;
  uStack_a00 = ~uStack_cb0 & local_ae8._8_8_;
  local_ae8._8_8_ = uStack_a00;
  local_ae8._0_8_ = local_a08;
  auVar56 = local_ae8;
  local_af8._12_4_ = auVar57._12_4_;
  uVar45 = local_af8._12_4_;
  local_ae8._0_4_ = (undefined4)local_a08;
  local_ae8._12_4_ = (undefined4)(uStack_a00 >> 0x20);
  uStack_64c = local_af8._12_4_;
  _local_648 = CONCAT44(auVar58._4_4_,local_ae8._0_4_);
  uStack_65c = local_ae8._12_4_;
  _local_658 = CONCAT44(auVar57._4_4_,local_ad8._0_4_);
  local_af8._4_4_ = local_ae8._12_4_;
  local_af8._0_4_ = uStack_660;
  local_af8 = CONCAT88(uStack_9f0,local_af8._0_8_);
  local_9f8 = local_af8._0_8_;
  local_478 = local_ac8._0_8_;
  uStack_470 = local_ac8._8_8_;
  local_488 = local_af8._0_8_;
  auVar29._8_8_ = local_a08;
  auVar29._0_8_ = local_af8._0_8_;
  local_ac8 = psubsw(auVar55,auVar29);
  uStack_140 = CONCAT44(uVar45,uStack_650);
  local_138 = local_ab8._0_8_;
  uStack_130 = local_ab8._8_8_;
  auVar32._8_8_ = uStack_140;
  auVar32._0_8_ = local_b08;
  local_ab8 = paddsw(auVar54,auVar32);
  local_280 = local_ac8;
  uVar17 = local_ac8._0_8_;
  uVar18 = local_ac8._8_8_;
  local_48 = local_a88._0_8_;
  uStack_40 = local_a88._8_8_;
  local_38._0_2_ = local_ac8._0_2_;
  local_38._2_2_ = local_ac8._2_2_;
  local_38._4_2_ = local_ac8._4_2_;
  local_38._6_2_ = local_ac8._6_2_;
  uStack_30._0_2_ = local_ac8._8_2_;
  uStack_30._2_2_ = local_ac8._10_2_;
  uStack_30._4_2_ = local_ac8._12_2_;
  uStack_30._6_2_ = local_ac8._14_2_;
  local_ac8._0_2_ =
       (ushort)((short)local_a8 < (short)local_38) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_38) * (short)local_38;
  local_ac8._2_2_ =
       (ushort)(local_a8._2_2_ < local_38._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_38._2_2_) * local_38._2_2_;
  local_ac8._4_2_ =
       (ushort)(local_a8._4_2_ < local_38._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_38._4_2_) * local_38._4_2_;
  local_ac8._6_2_ =
       (ushort)(local_a8._6_2_ < local_38._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_38._6_2_) * local_38._6_2_;
  local_ac8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_30) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_30) * (short)uStack_30;
  local_ac8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_30._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_30._2_2_) * uStack_30._2_2_;
  local_ac8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_30._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_30._4_2_) * uStack_30._4_2_;
  local_ac8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_30._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_30._6_2_) * uStack_30._6_2_;
  uVar19 = local_ac8._0_8_;
  uVar20 = local_ac8._8_8_;
  local_268 = local_a98._0_8_;
  uStack_260 = local_a98._8_8_;
  local_258._0_2_ = local_ac8._0_2_;
  local_258._2_2_ = local_ac8._2_2_;
  local_258._4_2_ = local_ac8._4_2_;
  local_258._6_2_ = local_ac8._6_2_;
  uStack_250._0_2_ = local_ac8._8_2_;
  uStack_250._2_2_ = local_ac8._10_2_;
  uStack_250._4_2_ = local_ac8._12_2_;
  uStack_250._6_2_ = local_ac8._14_2_;
  local_ac8._0_2_ =
       (ushort)((short)local_258 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_258 >= (short)local_1e8) * (short)local_258;
  local_ac8._2_2_ =
       (ushort)(local_258._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_258._2_2_ >= local_1e8._2_2_) * local_258._2_2_;
  local_ac8._4_2_ =
       (ushort)(local_258._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_258._4_2_ >= local_1e8._4_2_) * local_258._4_2_;
  local_ac8._6_2_ =
       (ushort)(local_258._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_258._6_2_ >= local_1e8._6_2_) * local_258._6_2_;
  local_ac8._8_2_ =
       (ushort)((short)uStack_250 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_250 >= (short)uStack_1e0) * (short)uStack_250;
  local_ac8._10_2_ =
       (ushort)(uStack_250._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_250._2_2_ >= uStack_1e0._2_2_) * uStack_250._2_2_;
  local_ac8._12_2_ =
       (ushort)(uStack_250._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_250._4_2_ >= uStack_1e0._4_2_) * uStack_250._4_2_;
  local_ac8._14_2_ =
       (ushort)(uStack_250._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_250._6_2_ >= uStack_1e0._6_2_) * uStack_250._6_2_;
  local_2c0 = local_ab8;
  uVar21 = local_ab8._0_8_;
  uVar22 = local_ab8._8_8_;
  local_28 = local_a88._0_8_;
  uStack_20 = local_a88._8_8_;
  local_18._0_2_ = local_ab8._0_2_;
  local_18._2_2_ = local_ab8._2_2_;
  local_18._4_2_ = local_ab8._4_2_;
  local_18._6_2_ = local_ab8._6_2_;
  uStack_10._0_2_ = local_ab8._8_2_;
  uStack_10._2_2_ = local_ab8._10_2_;
  uStack_10._4_2_ = local_ab8._12_2_;
  uStack_10._6_2_ = local_ab8._14_2_;
  local_ab8._0_2_ =
       (ushort)((short)local_a8 < (short)local_18) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_18) * (short)local_18;
  local_ab8._2_2_ =
       (ushort)(local_a8._2_2_ < local_18._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_18._2_2_) * local_18._2_2_;
  local_ab8._4_2_ =
       (ushort)(local_a8._4_2_ < local_18._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_18._4_2_) * local_18._4_2_;
  local_ab8._6_2_ =
       (ushort)(local_a8._6_2_ < local_18._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_18._6_2_) * local_18._6_2_;
  local_ab8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_10) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_10) * (short)uStack_10;
  local_ab8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_10._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_10._2_2_) * uStack_10._2_2_;
  local_ab8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_10._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_10._4_2_) * uStack_10._4_2_;
  local_ab8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_10._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_10._6_2_) * uStack_10._6_2_;
  uVar23 = local_ab8._0_8_;
  uVar24 = local_ab8._8_8_;
  local_2a8 = local_a98._0_8_;
  uStack_2a0 = local_a98._8_8_;
  local_298._0_2_ = local_ab8._0_2_;
  local_298._2_2_ = local_ab8._2_2_;
  local_298._4_2_ = local_ab8._4_2_;
  local_298._6_2_ = local_ab8._6_2_;
  uStack_290._0_2_ = local_ab8._8_2_;
  uStack_290._2_2_ = local_ab8._10_2_;
  uStack_290._4_2_ = local_ab8._12_2_;
  uStack_290._6_2_ = local_ab8._14_2_;
  local_ab8._0_2_ =
       (ushort)((short)local_298 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_298 >= (short)local_1e8) * (short)local_298;
  local_ab8._2_2_ =
       (ushort)(local_298._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_298._2_2_ >= local_1e8._2_2_) * local_298._2_2_;
  local_ab8._4_2_ =
       (ushort)(local_298._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_298._4_2_ >= local_1e8._4_2_) * local_298._4_2_;
  local_ab8._6_2_ =
       (ushort)(local_298._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_298._6_2_ >= local_1e8._6_2_) * local_298._6_2_;
  local_ab8._8_2_ =
       (ushort)((short)uStack_290 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_290 >= (short)uStack_1e0) * (short)uStack_290;
  local_ab8._10_2_ =
       (ushort)(uStack_290._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_290._2_2_ >= uStack_1e0._2_2_) * uStack_290._2_2_;
  local_ab8._12_2_ =
       (ushort)(uStack_290._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_290._4_2_ >= uStack_1e0._4_2_) * uStack_290._4_2_;
  local_ab8._14_2_ =
       (ushort)(uStack_290._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_290._6_2_ >= uStack_1e0._6_2_) * uStack_290._6_2_;
  auVar43._8_8_ = lStack_d90;
  auVar43._0_8_ = local_d98;
  local_158 = local_ac8._0_8_;
  uStack_150 = local_ac8._8_8_;
  auVar54 = paddsw(local_ac8,auVar43);
  local_ae8 = auVar56;
  local_a98 = auVar53;
  local_a50 = (__m128i *)&local_d98;
  local_a38 = &local_ca8;
  local_a30 = &local_cb8;
  local_a28 = &local_d18;
  local_a20 = &local_d08;
  local_9b8 = local_9c8;
  uStack_9b0 = uStack_9c0;
  local_668 = local_a08;
  local_598 = local_a78;
  uStack_590 = uStack_a70;
  uStack_480 = local_a08;
  local_368 = local_a78;
  uStack_360 = uStack_a70;
  local_308 = local_a78;
  uStack_300 = uStack_a70;
  local_2e8 = local_aa8;
  uStack_2e0 = uStack_aa0;
  local_298 = uVar23;
  uStack_290 = uVar24;
  local_278 = local_2b8;
  local_270 = local_2b0;
  local_258 = uVar19;
  uStack_250 = uVar20;
  local_238 = local_2b8;
  local_230 = local_2b0;
  local_218 = uVar15;
  uStack_210 = uVar16;
  local_1f8 = local_2b8;
  local_1f0 = local_2b0;
  local_1e8 = uVar11;
  uStack_1e0 = uVar12;
  local_1d8 = uVar9;
  uStack_1d0 = uVar10;
  local_1b8 = local_2b8;
  local_1b0 = local_2b0;
  local_1a8 = uVar5;
  uStack_1a0 = uVar6;
  local_198 = uVar3;
  uStack_190 = uVar4;
  local_f8 = local_9c8;
  uStack_f0 = local_9c8;
  local_a8 = local_a88._0_8_;
  uStack_a0 = local_a88._8_8_;
  local_98 = uVar1;
  uStack_90 = uVar2;
  local_78 = uVar7;
  uStack_70 = uVar8;
  local_58 = uVar13;
  uStack_50 = uVar14;
  local_38 = uVar17;
  uStack_30 = uVar18;
  local_18 = uVar21;
  uStack_10 = uVar22;
  *local_c48 = auVar54;
  local_188 = (*local_a50)[0];
  lStack_180 = (*local_a50)[1];
  local_178 = local_ab8._0_8_;
  uStack_170 = local_ab8._8_8_;
  auVar56 = paddsw(local_ab8,(undefined1  [16])*local_a50);
  *local_a48 = auVar56;
  pauVar44 = local_c48;
  local_558 = local_cd8;
  palStack_550 = palStack_cd0;
  local_568 = local_cf8;
  lStack_560 = lStack_cf0;
  local_4f8 = local_cd8;
  palStack_4f0 = palStack_cd0;
  local_508 = local_cf8;
  lStack_500 = lStack_cf0;
  auVar27._8_8_ = palStack_cd0;
  auVar27._0_8_ = local_cd8;
  auVar58._8_8_ = lStack_cf0;
  auVar58._0_8_ = local_cf8;
  local_538 = psubusw(auVar27,auVar58);
  local_518 = local_cf8;
  lStack_510 = lStack_cf0;
  local_528 = local_cd8;
  palStack_520 = palStack_cd0;
  auVar57._8_8_ = lStack_cf0;
  auVar57._0_8_ = local_cf8;
  auVar55._8_8_ = palStack_cd0;
  auVar55._0_8_ = local_cd8;
  local_548 = psubusw(auVar57,auVar55);
  uVar70 = local_538._0_8_ | local_548._0_8_;
  uVar71 = local_538._8_8_ | local_548._8_8_;
  local_4a8 = local_d28;
  uVar5 = local_4a8;
  uStack_4a0 = uStack_d20;
  uVar6 = uStack_4a0;
  local_498._0_2_ = (short)uVar70;
  local_498._2_2_ = (short)(uVar70 >> 0x10);
  local_498._4_2_ = (short)(uVar70 >> 0x20);
  local_498._6_2_ = (short)(uVar70 >> 0x30);
  uStack_490._0_2_ = (short)uVar71;
  uStack_490._2_2_ = (short)(uVar71 >> 0x10);
  uStack_490._4_2_ = (short)(uVar71 >> 0x20);
  uStack_490._6_2_ = (short)(uVar71 >> 0x30);
  local_4a8._0_2_ = (short)local_d28;
  local_4a8._2_2_ = (short)((ulong)local_d28 >> 0x10);
  local_4a8._4_2_ = (short)((ulong)local_d28 >> 0x20);
  local_4a8._6_2_ = (short)((ulong)local_d28 >> 0x30);
  uStack_4a0._0_2_ = (short)uStack_d20;
  uStack_4a0._2_2_ = (short)((ulong)uStack_d20 >> 0x10);
  uStack_4a0._4_2_ = (short)((ulong)uStack_d20 >> 0x20);
  uStack_4a0._6_2_ = (short)((ulong)uStack_d20 >> 0x30);
  uVar51 = (ushort)((short)local_498 < (short)local_4a8) * (short)local_4a8 |
           (ushort)((short)local_498 >= (short)local_4a8) * (short)local_498;
  uVar59 = (ushort)(local_498._2_2_ < local_4a8._2_2_) * local_4a8._2_2_ |
           (ushort)(local_498._2_2_ >= local_4a8._2_2_) * local_498._2_2_;
  uVar61 = (ushort)(local_498._4_2_ < local_4a8._4_2_) * local_4a8._4_2_ |
           (ushort)(local_498._4_2_ >= local_4a8._4_2_) * local_498._4_2_;
  uVar63 = (ushort)(local_498._6_2_ < local_4a8._6_2_) * local_4a8._6_2_ |
           (ushort)(local_498._6_2_ >= local_4a8._6_2_) * local_498._6_2_;
  uVar65 = (ushort)((short)uStack_490 < (short)uStack_4a0) * (short)uStack_4a0 |
           (ushort)((short)uStack_490 >= (short)uStack_4a0) * (short)uStack_490;
  uVar67 = (ushort)(uStack_490._2_2_ < uStack_4a0._2_2_) * uStack_4a0._2_2_ |
           (ushort)(uStack_490._2_2_ >= uStack_4a0._2_2_) * uStack_490._2_2_;
  uVar68 = (ushort)(uStack_490._4_2_ < uStack_4a0._4_2_) * uStack_4a0._4_2_ |
           (ushort)(uStack_490._4_2_ >= uStack_4a0._4_2_) * uStack_490._4_2_;
  uVar69 = (ushort)(uStack_490._6_2_ < uStack_4a0._6_2_) * uStack_4a0._6_2_ |
           (ushort)(uStack_490._6_2_ >= uStack_4a0._6_2_) * uStack_490._6_2_;
  local_cc8._0_4_ = CONCAT22(uVar59,uVar51);
  local_cc8._0_6_ = CONCAT24(uVar61,(undefined4)local_cc8);
  local_cc8 = CONCAT26(uVar63,(undefined6)local_cc8);
  uStack_cc0._0_2_ = uVar65;
  uStack_cc0._2_2_ = uVar67;
  uStack_cc0._4_2_ = uVar68;
  uStack_cc0._6_2_ = uVar69;
  local_4b8 = local_cc8;
  uStack_4b0 = uStack_cc0;
  local_4c8 = uStack_cc0;
  uStack_4c0 = 0;
  local_cc8._0_4_ =
       CONCAT22(((short)uVar59 < (short)uVar67) * uVar67 | ((short)uVar59 >= (short)uVar67) * uVar59
                ,((short)uVar51 < (short)uVar65) * uVar65 |
                 ((short)uVar51 >= (short)uVar65) * uVar51);
  local_cc8._0_6_ =
       CONCAT24(((short)uVar61 < (short)uVar68) * uVar68 | ((short)uVar61 >= (short)uVar68) * uVar61
                ,(undefined4)local_cc8);
  local_cc8 = CONCAT26(((short)uVar63 < (short)uVar69) * uVar69 |
                       ((short)uVar63 >= (short)uVar69) * uVar63,(undefined6)local_cc8);
  uStack_cc0._0_2_ = (-1 < (short)uVar65) * uVar65;
  uStack_cc0._2_2_ = (-1 < (short)uVar67) * uVar67;
  uStack_cc0._4_2_ = (-1 < (short)uVar68) * uVar68;
  uStack_cc0._6_2_ = (-1 < (short)uVar69) * uVar69;
  local_57c = local_c64 - 8;
  local_578 = local_da8;
  uStack_570 = uStack_da0;
  auVar54._8_8_ = uStack_da0;
  auVar54._0_8_ = local_da8;
  local_4e8 = psllw(auVar54,ZEXT416(local_57c));
  local_4d8 = local_cc8;
  uStack_4d0 = uStack_cc0;
  auVar28._8_8_ = uStack_cc0;
  auVar28._0_8_ = local_cc8;
  auVar56 = psubusw(auVar28,local_4e8);
  local_cc8 = auVar56._0_8_;
  uStack_cc0 = auVar56._8_8_;
  local_8c8 = local_cc8;
  uVar3 = local_8c8;
  uStack_8c0 = uStack_cc0;
  uVar4 = uStack_8c0;
  local_8d8 = local_d78;
  uVar1 = local_8d8;
  uStack_8d0 = uStack_d70;
  uVar2 = uStack_8d0;
  local_8c8._0_2_ = auVar56._0_2_;
  local_8c8._2_2_ = auVar56._2_2_;
  local_8c8._4_2_ = auVar56._4_2_;
  local_8c8._6_2_ = auVar56._6_2_;
  uStack_8c0._0_2_ = auVar56._8_2_;
  uStack_8c0._2_2_ = auVar56._10_2_;
  uStack_8c0._4_2_ = auVar56._12_2_;
  uStack_8c0._6_2_ = auVar56._14_2_;
  local_8d8._0_2_ = (short)local_d78;
  local_8d8._2_2_ = (short)((ulong)local_d78 >> 0x10);
  local_8d8._4_2_ = (short)((ulong)local_d78 >> 0x20);
  local_8d8._6_2_ = (short)((ulong)local_d78 >> 0x30);
  uStack_8d0._0_2_ = (short)uStack_d70;
  uStack_8d0._2_2_ = (short)((ulong)uStack_d70 >> 0x10);
  uStack_8d0._4_2_ = (short)((ulong)uStack_d70 >> 0x20);
  uStack_8d0._6_2_ = (short)((ulong)uStack_d70 >> 0x30);
  local_cc8._0_4_ =
       CONCAT22(-(ushort)(local_8c8._2_2_ == local_8d8._2_2_),
                -(ushort)((short)local_8c8 == (short)local_8d8));
  local_cc8._0_6_ = CONCAT24(-(ushort)(local_8c8._4_2_ == local_8d8._4_2_),(undefined4)local_cc8);
  local_cc8 = CONCAT26(-(ushort)(local_8c8._6_2_ == local_8d8._6_2_),(undefined6)local_cc8);
  uStack_cc0._0_2_ = -(ushort)((short)uStack_8c0 == (short)uStack_8d0);
  uStack_cc0._2_2_ = -(ushort)(uStack_8c0._2_2_ == uStack_8d0._2_2_);
  uStack_cc0._4_2_ = -(ushort)(uStack_8c0._4_2_ == uStack_8d0._4_2_);
  uStack_cc0._6_2_ = -(ushort)(uStack_8c0._6_2_ == uStack_8d0._6_2_);
  local_918 = local_cc8;
  uStack_910 = uStack_cc0;
  local_928 = local_ca8;
  uStack_920 = uStack_ca0;
  local_b98 = local_cc8 & local_ca8;
  local_8f8 = local_d78;
  uStack_8f0 = uStack_d70;
  local_8e8._0_2_ = (short)local_b98;
  local_8e8._2_2_ = (short)(local_b98 >> 0x10);
  local_8e8._4_2_ = (short)(local_b98 >> 0x20);
  local_8e8._6_2_ = (short)(local_b98 >> 0x30);
  local_908 = -(ushort)((short)local_8e8 == (short)local_8d8);
  sStack_906 = -(ushort)(local_8e8._2_2_ == local_8d8._2_2_);
  sStack_904 = -(ushort)(local_8e8._4_2_ == local_8d8._4_2_);
  sStack_902 = -(ushort)(local_8e8._6_2_ == local_8d8._6_2_);
  sStack_900 = -(ushort)((short)local_8e8 == (short)uStack_8d0);
  sStack_8fe = -(ushort)(local_8e8._2_2_ == uStack_8d0._2_2_);
  sStack_8fc = -(ushort)(local_8e8._4_2_ == uStack_8d0._4_2_);
  uStack_8fa = -(ushort)(local_8e8._6_2_ == uStack_8d0._6_2_);
  auVar56._2_2_ = sStack_906;
  auVar56._0_2_ = local_908;
  auVar56._4_2_ = sStack_904;
  auVar56._6_2_ = sStack_902;
  auVar56._8_2_ = sStack_900;
  auVar56._10_2_ = sStack_8fe;
  auVar56._12_2_ = sStack_8fc;
  auVar56._14_2_ = uStack_8fa;
  local_8e8 = local_b98;
  uStack_8e0 = local_b98;
  local_8d8 = uVar1;
  uStack_8d0 = uVar2;
  local_8c8 = uVar3;
  uStack_8c0 = uVar4;
  local_4a8 = uVar5;
  uStack_4a0 = uVar6;
  local_498 = uVar70;
  uStack_490 = uVar71;
  local_cc8 = local_b98;
  uStack_cc0 = local_b98;
  if ((ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) | (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_8fa >> 7) & 1) << 0xe | uStack_8fa & 0x8000) != 0xffff) {
    local_738 = local_cf8;
    lVar49 = local_738;
    uStack_730 = lStack_cf0;
    lVar50 = uStack_730;
    local_748 = local_cf8;
    lStack_740 = lStack_cf0;
    local_738._0_2_ = (short)local_cf8;
    local_738._2_2_ = (short)((ulong)local_cf8 >> 0x10);
    local_738._4_2_ = (short)((ulong)local_cf8 >> 0x20);
    local_738._6_2_ = (short)((ulong)local_cf8 >> 0x30);
    uStack_730._0_2_ = (short)lStack_cf0;
    uStack_730._2_2_ = (short)((ulong)lStack_cf0 >> 0x10);
    uStack_730._4_2_ = (short)((ulong)lStack_cf0 >> 0x20);
    uStack_730._6_2_ = (short)((ulong)lStack_cf0 >> 0x30);
    local_758 = (short)local_738 * 2;
    sStack_756 = local_738._2_2_ * 2;
    sStack_754 = local_738._4_2_ * 2;
    sStack_752 = local_738._6_2_ * 2;
    sStack_750 = (short)uStack_730 * 2;
    sStack_74e = uStack_730._2_2_ * 2;
    sStack_74c = uStack_730._4_2_ * 2;
    sStack_74a = uStack_730._6_2_ * 2;
    local_768 = local_ce8;
    lVar47 = local_768;
    uStack_760 = lStack_ce0;
    lVar48 = uStack_760;
    local_768._0_2_ = (short)local_ce8;
    local_768._2_2_ = (short)((ulong)local_ce8 >> 0x10);
    local_768._4_2_ = (short)((ulong)local_ce8 >> 0x20);
    local_768._6_2_ = (short)((ulong)local_ce8 >> 0x30);
    uStack_760._0_2_ = (short)lStack_ce0;
    uStack_760._2_2_ = (short)((ulong)lStack_ce0 >> 0x10);
    uStack_760._4_2_ = (short)((ulong)lStack_ce0 >> 0x20);
    uStack_760._6_2_ = (short)((ulong)lStack_ce0 >> 0x30);
    local_de8 = local_758 + (short)local_768;
    sStack_de6 = sStack_756 + local_768._2_2_;
    sStack_de4 = sStack_754 + local_768._4_2_;
    sStack_de2 = sStack_752 + local_768._6_2_;
    sStack_de0 = sStack_750 + (short)uStack_760;
    sStack_dde = sStack_74e + uStack_760._2_2_;
    sStack_ddc = sStack_74c + uStack_760._4_2_;
    sStack_dda = sStack_74a + uStack_760._6_2_;
    local_778 = local_ce8;
    lStack_770 = lStack_ce0;
    local_788 = local_cd8;
    lVar46 = local_788;
    uStack_780 = palStack_cd0;
    palVar72 = uStack_780;
    local_788._0_2_ = (short)local_cd8;
    local_788._2_2_ = (short)((ulong)local_cd8 >> 0x10);
    local_788._4_2_ = (short)((ulong)local_cd8 >> 0x20);
    local_788._6_2_ = (short)((ulong)local_cd8 >> 0x30);
    uStack_780._0_2_ = (short)palStack_cd0;
    uStack_780._2_2_ = (short)((ulong)palStack_cd0 >> 0x10);
    uStack_780._4_2_ = (short)((ulong)palStack_cd0 >> 0x20);
    uStack_780._6_2_ = (short)((ulong)palStack_cd0 >> 0x30);
    local_df8 = (short)local_768 + (short)local_788;
    sStack_df6 = local_768._2_2_ + local_788._2_2_;
    sStack_df4 = local_768._4_2_ + local_788._4_2_;
    sStack_df2 = local_768._6_2_ + local_788._6_2_;
    sStack_df0 = (short)uStack_760 + (short)uStack_780;
    sStack_dee = uStack_760._2_2_ + uStack_780._2_2_;
    sStack_dec = uStack_760._4_2_ + uStack_780._4_2_;
    sStack_dea = uStack_760._6_2_ + uStack_780._6_2_;
    local_798 = CONCAT26(sStack_de2,CONCAT24(sStack_de4,CONCAT22(sStack_de6,local_de8)));
    uStack_790 = CONCAT26(sStack_dda,CONCAT24(sStack_ddc,CONCAT22(sStack_dde,sStack_de0)));
    local_7a8 = local_d88;
    uVar1 = local_7a8;
    uStack_7a0 = uStack_d80;
    uVar2 = uStack_7a0;
    local_7a8._0_2_ = (short)local_d88;
    local_7a8._2_2_ = (short)((ulong)local_d88 >> 0x10);
    local_7a8._4_2_ = (short)((ulong)local_d88 >> 0x20);
    local_7a8._6_2_ = (short)((ulong)local_d88 >> 0x30);
    uStack_7a0._0_2_ = (short)uStack_d80;
    uStack_7a0._2_2_ = (short)((ulong)uStack_d80 >> 0x10);
    uStack_7a0._4_2_ = (short)((ulong)uStack_d80 >> 0x20);
    uStack_7a0._6_2_ = (short)((ulong)uStack_d80 >> 0x30);
    local_7b8 = local_de8 + (short)local_7a8;
    sStack_7b6 = sStack_de6 + local_7a8._2_2_;
    sStack_7b4 = sStack_de4 + local_7a8._4_2_;
    sStack_7b2 = sStack_de2 + local_7a8._6_2_;
    sStack_7b0 = sStack_de0 + (short)uStack_7a0;
    sStack_7ae = sStack_dde + uStack_7a0._2_2_;
    sStack_7ac = sStack_ddc + uStack_7a0._4_2_;
    sStack_7aa = sStack_dda + uStack_7a0._6_2_;
    local_7c8 = CONCAT26(sStack_df2,CONCAT24(sStack_df4,CONCAT22(sStack_df6,local_df8)));
    uStack_7c0 = CONCAT26(sStack_dea,CONCAT24(sStack_dec,CONCAT22(sStack_dee,sStack_df0)));
    sVar52 = local_7b8 + local_df8;
    sVar60 = sStack_7b6 + sStack_df6;
    sVar62 = sStack_7b4 + sStack_df4;
    sVar64 = sStack_7b2 + sStack_df2;
    sStack_6d0 = sStack_7b0 + sStack_df0;
    sStack_6ce = sStack_7ae + sStack_dee;
    sStack_6cc = sStack_7ac + sStack_dec;
    sStack_6ca = sStack_7aa + sStack_dea;
    local_db8._0_4_ = CONCAT22(sVar60,sVar52);
    local_db8._0_6_ = CONCAT24(sVar62,(undefined4)local_db8);
    local_db8 = CONCAT26(sVar64,(undefined6)local_db8);
    uStack_db0._0_4_ = CONCAT22(sStack_6ce,sStack_6d0);
    uStack_db0._0_6_ = CONCAT24(sStack_6cc,(undefined4)uStack_db0);
    uStack_db0 = CONCAT26(sStack_6ca,(undefined6)uStack_db0);
    local_7d8 = local_cd8;
    palStack_7d0 = palStack_cd0;
    local_7e8 = local_cd8;
    palStack_7e0 = palStack_cd0;
    local_7f8 = (short)local_788 * 2;
    sStack_7f6 = local_788._2_2_ * 2;
    sStack_7f4 = local_788._4_2_ * 2;
    sStack_7f2 = local_788._6_2_ * 2;
    sStack_7f0 = (short)uStack_780 * 2;
    sStack_7ee = uStack_780._2_2_ * 2;
    sStack_7ec = uStack_780._4_2_ * 2;
    sStack_7ea = uStack_780._6_2_ * 2;
    lVar25 = (*local_c28)[0];
    lVar26 = (*local_c28)[1];
    local_808._0_2_ = (short)lVar25;
    local_808._2_2_ = (short)((ulong)lVar25 >> 0x10);
    local_808._4_2_ = (short)((ulong)lVar25 >> 0x20);
    local_808._6_2_ = (short)((ulong)lVar25 >> 0x30);
    uStack_800._0_2_ = (short)lVar26;
    uStack_800._2_2_ = (short)((ulong)lVar26 >> 0x10);
    uStack_800._4_2_ = (short)((ulong)lVar26 >> 0x20);
    uStack_800._6_2_ = (short)((ulong)lVar26 >> 0x30);
    local_dc8._0_4_ = CONCAT22(sStack_7f6 + local_808._2_2_,local_7f8 + (short)local_808);
    local_dc8._0_6_ = CONCAT24(sStack_7f4 + local_808._4_2_,(undefined4)local_dc8);
    local_dc8 = CONCAT26(sStack_7f2 + local_808._6_2_,(undefined6)local_dc8);
    uStack_dc0._0_4_ = CONCAT22(sStack_7ee + uStack_800._2_2_,sStack_7f0 + (short)uStack_800);
    uStack_dc0._0_6_ = CONCAT24(sStack_7ec + uStack_800._4_2_,(undefined4)uStack_dc0);
    uStack_dc0 = CONCAT26(sStack_7ea + uStack_800._6_2_,(undefined6)uStack_dc0);
    local_818 = local_db8;
    uStack_810 = uStack_db0;
    local_828 = local_dc8;
    uStack_820 = uStack_dc0;
    uStack_d50 = sVar52 + local_7f8 + (short)local_808;
    uStack_d4e = sVar60 + sStack_7f6 + local_808._2_2_;
    uStack_d4c = sVar62 + sStack_7f4 + local_808._4_2_;
    uStack_d4a = sVar64 + sStack_7f2 + local_808._6_2_;
    local_dc8._0_4_ = CONCAT22(uStack_d4e,uStack_d50);
    local_dc8._0_6_ = CONCAT24(uStack_d4c,(undefined4)local_dc8);
    local_dc8 = CONCAT26(uStack_d4a,(undefined6)local_dc8);
    uStack_dc0._0_4_ =
         CONCAT22(sStack_6ce + sStack_7ee + uStack_800._2_2_,
                  sStack_6d0 + sStack_7f0 + (short)uStack_800);
    uStack_dc0._0_6_ = CONCAT24(sStack_6cc + sStack_7ec + uStack_800._4_2_,(undefined4)uStack_dc0);
    uStack_dc0 = CONCAT26(sStack_6ca + sStack_7ea + uStack_800._6_2_,(undefined6)uStack_dc0);
    local_848 = CONCAT26(sStack_dda,CONCAT24(sStack_ddc,CONCAT22(sStack_dde,sStack_de0)));
    local_838 = local_db8;
    uStack_830 = uStack_db0;
    uStack_840 = 0;
    uVar51 = sVar52 + sStack_de0;
    uVar59 = sVar60 + sStack_dde;
    uVar61 = sVar62 + sStack_ddc;
    uVar63 = sVar64 + sStack_dda;
    local_db8._0_4_ = CONCAT22(uVar59,uVar51);
    local_db8._0_6_ = CONCAT24(uVar61,(undefined4)local_db8);
    local_db8 = CONCAT26(uVar63,(undefined6)local_db8);
    uStack_db0._0_4_ = CONCAT22(sStack_6ce,sStack_6d0);
    uStack_db0._0_6_ = CONCAT24(sStack_6cc,(undefined4)uStack_db0);
    uStack_db0 = CONCAT26(sStack_6ca,(undefined6)uStack_db0);
    local_ba8 = local_db8;
    uStack_ba0 = uStack_db0;
    local_bb8 = local_dc8;
    uStack_bb0 = uStack_dc0;
    local_678 = local_db8;
    uStack_670 = local_dc8;
    local_67c = 3;
    local_d58 = uVar51 >> 3;
    uStack_d56 = uVar59 >> 3;
    uStack_d54 = uVar61 >> 3;
    uStack_d52 = uVar63 >> 3;
    uStack_d50 = uStack_d50 >> 3;
    uStack_d4e = uStack_d4e >> 3;
    uStack_d4c = uStack_d4c >> 3;
    uStack_d4a = uStack_d4a >> 3;
    local_6b8 = local_db8;
    uStack_6b0 = uStack_db0;
    local_6c8 = local_cd8;
    palStack_6c0 = palStack_cd0;
    local_6d8 = uVar51 - (short)local_788;
    sStack_6d6 = uVar59 - local_788._2_2_;
    sStack_6d4 = uVar61 - local_788._4_2_;
    sStack_6d2 = uVar63 - local_788._6_2_;
    sStack_6d0 = sStack_6d0 - (short)uStack_780;
    sStack_6ce = sStack_6ce - uStack_780._2_2_;
    sStack_6cc = sStack_6cc - uStack_780._4_2_;
    sStack_6ca = sStack_6ca - uStack_780._6_2_;
    local_6e8 = local_ce8;
    lStack_6e0 = lStack_ce0;
    sStack_710 = sStack_6d0 - (short)uStack_760;
    sStack_70e = sStack_6ce - uStack_760._2_2_;
    sStack_70c = sStack_6cc - uStack_760._4_2_;
    sStack_70a = sStack_6ca - uStack_760._6_2_;
    local_db8._0_4_ = CONCAT22(sStack_6d6 - local_768._2_2_,local_6d8 - (short)local_768);
    local_db8._0_6_ = CONCAT24(sStack_6d4 - local_768._4_2_,(undefined4)local_db8);
    local_db8 = CONCAT26(sStack_6d2 - local_768._6_2_,(undefined6)local_db8);
    uStack_db0._0_4_ = CONCAT22(sStack_70e,sStack_710);
    uStack_db0._0_6_ = CONCAT24(sStack_70c,(undefined4)uStack_db0);
    uStack_db0 = CONCAT26(sStack_70a,(undefined6)uStack_db0);
    local_868 = CONCAT26(sStack_dea,CONCAT24(sStack_dec,CONCAT22(sStack_dee,sStack_df0)));
    local_858 = local_db8;
    uStack_850 = uStack_db0;
    uStack_860 = 0;
    local_d68 = (local_6d8 - (short)local_768) + sStack_df0;
    uStack_d66 = (sStack_6d6 - local_768._2_2_) + sStack_dee;
    uStack_d64 = (sStack_6d4 - local_768._4_2_) + sStack_dec;
    uStack_d62 = (sStack_6d2 - local_768._6_2_) + sStack_dea;
    local_db8._0_4_ = CONCAT22(uStack_d66,local_d68);
    local_db8._0_6_ = CONCAT24(uStack_d64,(undefined4)local_db8);
    local_db8 = CONCAT26(uStack_d62,(undefined6)local_db8);
    uStack_db0._0_4_ = CONCAT22(sStack_70e,sStack_710);
    uStack_db0._0_6_ = CONCAT24(sStack_70c,(undefined4)uStack_db0);
    uStack_db0 = CONCAT26(sStack_70a,(undefined6)uStack_db0);
    local_6f8 = local_db8;
    uStack_6f0 = uStack_db0;
    local_708 = local_ce8;
    lStack_700 = lStack_ce0;
    local_718 = local_d68 - (short)local_768;
    sStack_716 = uStack_d66 - local_768._2_2_;
    sStack_714 = uStack_d64 - local_768._4_2_;
    sStack_712 = uStack_d62 - local_768._6_2_;
    sStack_710 = sStack_710 - (short)uStack_760;
    sStack_70e = sStack_70e - uStack_760._2_2_;
    sStack_70c = sStack_70c - uStack_760._4_2_;
    sStack_70a = sStack_70a - uStack_760._6_2_;
    local_728 = local_cf8;
    lStack_720 = lStack_cf0;
    local_dd8 = CONCAT26(sStack_712 - local_738._6_2_,
                         CONCAT24(sStack_714 - local_738._4_2_,
                                  CONCAT22(sStack_716 - local_738._2_2_,local_718 - (short)local_738
                                          )));
    uStack_dd0 = CONCAT26(sStack_70a - uStack_730._6_2_,
                          CONCAT24(sStack_70c - uStack_730._4_2_,
                                   CONCAT22(sStack_70e - uStack_730._2_2_,
                                            sStack_710 - (short)uStack_730)));
    local_888 = (*local_c38)[0];
    lStack_880 = (*local_c38)[1];
    local_878._0_2_ = (short)local_888;
    local_878._2_2_ = (short)((ulong)local_888 >> 0x10);
    local_878._4_2_ = (short)((ulong)local_888 >> 0x20);
    local_878._6_2_ = (short)((ulong)local_888 >> 0x30);
    uStack_870._0_2_ = (short)lStack_880;
    uStack_870._2_2_ = (short)((ulong)lStack_880 >> 0x10);
    uStack_870._4_2_ = (short)((ulong)lStack_880 >> 0x20);
    uStack_870._6_2_ = (short)((ulong)lStack_880 >> 0x30);
    local_dc8._0_4_ = CONCAT22(local_878._2_2_ * 2,(short)local_878 * 2);
    local_dc8._0_6_ = CONCAT24(local_878._4_2_ * 2,(undefined4)local_dc8);
    local_dc8 = CONCAT26(local_878._6_2_ * 2,(undefined6)local_dc8);
    uStack_dc0._0_4_ = CONCAT22(uStack_870._2_2_ * 2,(short)uStack_870 * 2);
    uStack_dc0._0_6_ = CONCAT24(uStack_870._4_2_ * 2,(undefined4)uStack_dc0);
    uStack_dc0 = CONCAT26(uStack_870._6_2_ * 2,(undefined6)uStack_dc0);
    local_898 = local_dd8;
    uStack_890 = uStack_dd0;
    local_8a8 = local_dc8;
    uStack_8a0 = uStack_dc0;
    uStack_d60 = (local_718 - (short)local_738) + (short)local_878 * 2;
    uStack_d5e = (sStack_716 - local_738._2_2_) + local_878._2_2_ * 2;
    uStack_d5c = (sStack_714 - local_738._4_2_) + local_878._4_2_ * 2;
    uStack_d5a = (sStack_712 - local_738._6_2_) + local_878._6_2_ * 2;
    local_dc8._0_4_ = CONCAT22(uStack_d5e,uStack_d60);
    local_dc8._0_6_ = CONCAT24(uStack_d5c,(undefined4)local_dc8);
    local_dc8 = CONCAT26(uStack_d5a,(undefined6)local_dc8);
    uStack_dc0._0_4_ =
         CONCAT22((sStack_70e - uStack_730._2_2_) + uStack_870._2_2_ * 2,
                  (sStack_710 - (short)uStack_730) + (short)uStack_870 * 2);
    uStack_dc0._0_6_ =
         CONCAT24((sStack_70c - uStack_730._4_2_) + uStack_870._4_2_ * 2,(undefined4)uStack_dc0);
    uStack_dc0 = CONCAT26((sStack_70a - uStack_730._6_2_) + uStack_870._6_2_ * 2,
                          (undefined6)uStack_dc0);
    local_bc8 = local_db8;
    uStack_bc0 = uStack_db0;
    local_bd8 = local_dc8;
    uStack_bd0 = uStack_dc0;
    uStack_db0 = local_dc8;
    local_698 = local_db8;
    uStack_690 = local_dc8;
    local_69c = 3;
    local_d68 = local_d68 >> 3;
    uStack_d66 = uStack_d66 >> 3;
    uStack_d64 = uStack_d64 >> 3;
    uStack_d62 = uStack_d62 >> 3;
    uStack_d60 = uStack_d60 >> 3;
    uStack_d5e = uStack_d5e >> 3;
    uStack_d5c = uStack_d5c >> 3;
    uStack_d5a = uStack_d5a >> 3;
    local_608 = *(ulong *)*local_c48;
    uStack_600 = *(ulong *)((long)*local_c48 + 8);
    local_d48 = ~local_b98 & local_608;
    uStack_d40 = ~local_b98 & uStack_600;
    local_948 = CONCAT26(uStack_d62,CONCAT24(uStack_d64,CONCAT22(uStack_d66,local_d68)));
    uStack_940 = CONCAT26(uStack_d5a,CONCAT24(uStack_d5c,CONCAT22(uStack_d5e,uStack_d60)));
    local_d18 = local_b98 & local_948;
    uStack_d10 = local_b98 & uStack_940;
    uVar70 = uStack_d40 | uStack_d10;
    local_938 = local_b98;
    uStack_930 = local_b98;
    local_878 = local_888;
    uStack_870 = lStack_880;
    local_808 = lVar25;
    uStack_800 = lVar26;
    local_7a8 = uVar1;
    uStack_7a0 = uVar2;
    local_788 = lVar46;
    uStack_780 = palVar72;
    local_768 = lVar47;
    uStack_760 = lVar48;
    local_738 = lVar49;
    uStack_730 = lVar50;
    local_5f8 = local_b98;
    uStack_5f0 = local_b98;
    local_5c8 = local_d18;
    uStack_5c0 = uStack_d10;
    local_5b8 = local_d48;
    uStack_5b0 = uStack_d40;
    *(ulong *)*local_c48 = local_d48 | local_d18;
    *(ulong *)((long)*pauVar44 + 8) = uVar70;
    pauVar44 = local_c40;
    lVar25 = *(longlong *)*local_c40;
    lVar26 = *(longlong *)((long)*local_c40 + 8);
    local_618 = local_cc8;
    uVar70 = local_618;
    uStack_610 = uStack_cc0;
    uVar71 = uStack_610;
    local_618._0_4_ = (uint)local_cc8;
    local_618._4_4_ = (uint)(local_cc8 >> 0x20);
    uStack_610._0_4_ = (uint)uStack_cc0;
    uStack_610._4_4_ = (uint)(uStack_cc0 >> 0x20);
    local_628._0_4_ = (uint)lVar25;
    local_628._4_4_ = (uint)((ulong)lVar25 >> 0x20);
    uStack_620._0_4_ = (uint)lVar26;
    uStack_620._4_4_ = (uint)((ulong)lVar26 >> 0x20);
    local_d38 = ((uint)local_618 ^ 0xffffffff) & (uint)local_628;
    uStack_d34 = (local_618._4_4_ ^ 0xffffffff) & local_628._4_4_;
    uStack_d30 = ((uint)uStack_610 ^ 0xffffffff) & (uint)uStack_620;
    uStack_d2c = (uStack_610._4_4_ ^ 0xffffffff) & uStack_620._4_4_;
    local_968 = CONCAT26(uStack_d52,CONCAT24(uStack_d54,CONCAT22(uStack_d56,local_d58)));
    uStack_960 = CONCAT26(uStack_d4a,CONCAT24(uStack_d4c,CONCAT22(uStack_d4e,uStack_d50)));
    local_958 = local_cc8;
    uStack_950 = uStack_cc0;
    local_d08 = local_cc8 & local_968;
    uStack_d00 = uStack_cc0 & uStack_960;
    local_5d8 = CONCAT44(uStack_d34,local_d38);
    uStack_5d0 = CONCAT44(uStack_d2c,uStack_d30);
    uVar66 = uStack_5d0 | uStack_d00;
    local_628 = lVar25;
    uStack_620 = lVar26;
    local_618 = uVar70;
    uStack_610 = uVar71;
    local_5e8 = local_d08;
    uStack_5e0 = uStack_d00;
    *(ulong *)*local_c40 = local_5d8 | local_d08;
    *(ulong *)((long)*pauVar44 + 8) = uVar66;
  }
  local_f88[2] = lStack_f90;
  uStack_f70 = 0;
  local_f88[0] = lStack_fa0;
  local_f88[1] = 0;
  highbd_transpose4x8_8x4_low_sse2
            ((__m128i *)(local_f88 + 2),(__m128i *)&local_f98,(__m128i *)&local_fa8,
             (__m128i *)local_f88,&local_eb8,&local_ec8,&local_ed8,&local_ee8);
  *(longlong *)(local_e80 + -4) = local_eb8[0];
  *(longlong *)(local_e80 + -4 + (long)local_e84 * 2) = local_ec8[0];
  *(longlong *)(local_e80 + -4 + (long)(local_e84 * 2) * 2) = local_ed8[0];
  *(longlong *)(local_e80 + -4 + (long)(local_e84 * 3) * 2) = local_ee8[0];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x3, x2, x1, x0, p0, q0;
  __m128i p1p0, q1q0;

  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&x3, &x2, &x1, &x0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  highbd_lpf_internal_6_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &p1p0, &q1q0, blimit,
                             limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose4x8_8x4_low_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}